

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl_scene.cpp
# Opt level: O0

void __thiscall FGLRenderer::RenderView(FGLRenderer *this,player_t *player)

{
  bool bVar1;
  uint uVar2;
  DFrameBuffer *pDVar3;
  ADynamicLight *pAVar4;
  AActor *pAVar5;
  sector_t *viewsector;
  TThinkerIterator<ADynamicLight> it;
  float local_30;
  float ratio;
  float fovratio;
  bool saved_niv;
  AActor **LastCamera;
  OpenGLFrameBuffer *GLTarget;
  player_t *player_local;
  FGLRenderer *this_local;
  
  pDVar3 = screen + 0x22;
  checkBenchActive();
  bVar1 = TObjPtr<AActor>::operator!=
                    (&player->camera,
                     (AActor *)
                     (pDVar3->super_DSimpleCanvas).super_DCanvas.super_DObject._vptr_DObject);
  if (bVar1) {
    R_ResetViewInterpolation();
    pAVar5 = ::TObjPtr::operator_cast_to_AActor_((TObjPtr *)&player->camera);
    (pDVar3->super_DSimpleCanvas).super_DCanvas.super_DObject._vptr_DObject = (_func_int **)pAVar5;
  }
  FRenderState::SetVertexBuffer(&gl_RenderState,&this->mVBO->super_FVertexBuffer);
  FFlatVertexBuffer::Reset(GLRenderer->mVBO);
  ResetProfilingData();
  bVar1 = FBoolCVar::operator_cast_to_bool(&cl_capfps);
  if ((bVar1) || ((r_NoInterpolate & 1U) != 0)) {
    r_TicFracF = 1.0;
  }
  else {
    r_TicFracF = I_GetTimeFrac(&r_FrameTime);
  }
  uVar2 = I_MSTime();
  gl_frameMS = (long)uVar2;
  P_FindParticleSubsectors();
  if ((gl.legacyMode & 1U) == 0) {
    FLightBuffer::Clear(GLRenderer->mLights);
  }
  bVar1 = (bool)(NoInterpolateView & 1);
  NoInterpolateView = false;
  FCanvasTextureInfo::UpdateAll();
  it.super_FThinkerIterator._20_4_ = RenderView::ratios[WidescreenRatio];
  NoInterpolateView = bVar1;
  bVar1 = Is54Aspect(WidescreenRatio);
  if (bVar1) {
    local_30 = (float)it.super_FThinkerIterator._20_4_;
  }
  else {
    local_30 = 1.333333;
  }
  SetFixedColormap(this,player);
  TThinkerIterator<ADynamicLight>::TThinkerIterator
            ((TThinkerIterator<ADynamicLight> *)&viewsector,0x40);
  pAVar4 = TThinkerIterator<ADynamicLight>::Next((TThinkerIterator<ADynamicLight> *)&viewsector);
  GLRenderer->mLightCount = (uint)(pAVar4 != (ADynamicLight *)0x0);
  pAVar5 = ::TObjPtr::operator_cast_to_AActor_((TObjPtr *)&player->camera);
  RenderViewpoint(this,pAVar5,(GL_IRECT *)0x0,(float)FieldOfView.Degrees,
                  (float)it.super_FThinkerIterator._20_4_,local_30,true,true);
  glcycle_t::Unclock(&All);
  return;
}

Assistant:

void FGLRenderer::RenderView (player_t* player)
{
	OpenGLFrameBuffer* GLTarget = static_cast<OpenGLFrameBuffer*>(screen);
	AActor *&LastCamera = GLTarget->LastCamera;

	checkBenchActive();
	if (player->camera != LastCamera)
	{
		// If the camera changed don't interpolate
		// Otherwise there will be some not so nice effects.
		R_ResetViewInterpolation();
		LastCamera=player->camera;
	}

	gl_RenderState.SetVertexBuffer(mVBO);
	GLRenderer->mVBO->Reset();

	// reset statistics counters
	ResetProfilingData();

	// Get this before everything else
	if (cl_capfps || r_NoInterpolate) r_TicFracF = 1.;
	else r_TicFracF = I_GetTimeFrac (&r_FrameTime);
	gl_frameMS = I_MSTime();

	P_FindParticleSubsectors ();

	if (!gl.legacyMode) GLRenderer->mLights->Clear();

	// NoInterpolateView should have no bearing on camera textures, but needs to be preserved for the main view below.
	bool saved_niv = NoInterpolateView;
	NoInterpolateView = false;
	// prepare all camera textures that have been used in the last frame
	FCanvasTextureInfo::UpdateAll();
	NoInterpolateView = saved_niv;


	// I stopped using BaseRatioSizes here because the information there wasn't well presented.
	//							4:3				16:9		16:10		17:10		5:4
	static float ratios[]={1.333333f, 1.777777f, 1.6f, 1.7f, 1.25f, 1.7f, 2.333333f};

	// now render the main view
	float fovratio;
	float ratio = ratios[WidescreenRatio];
	if (! Is54Aspect(WidescreenRatio))
	{
		fovratio = 1.333333f;
	}
	else
	{
		fovratio = ratio;
	}

	SetFixedColormap (player);

	// Check if there's some lights. If not some code can be skipped.
	TThinkerIterator<ADynamicLight> it(STAT_DLIGHT);
	GLRenderer->mLightCount = ((it.Next()) != NULL);

	sector_t * viewsector = RenderViewpoint(player->camera, NULL, FieldOfView.Degrees, ratio, fovratio, true, true);

	All.Unclock();
}